

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O1

int __thiscall
QAbstractEventDispatcherV2::remainingTime(QAbstractEventDispatcherV2 *this,int timerId)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_00000034;
  
  lVar1 = (**(code **)(*(long *)this + 0xd8))(this,CONCAT44(in_register_00000034,timerId));
  lVar1 = (ulong)((lVar1 / 1000000) * 1000000 < lVar1) + lVar1 / 1000000;
  if (0x7ffffffe < lVar1) {
    lVar1 = 0x7fffffff;
  }
  lVar2 = -0x80000000;
  if (-0x80000000 < lVar1) {
    lVar2 = lVar1;
  }
  return (int)lVar2;
}

Assistant:

int QAbstractEventDispatcherV2::remainingTime(int timerId)
{
    auto self = static_cast<QAbstractEventDispatcherV2 *>(this);
    return fromDuration<int>(self->remainingTime(Qt::TimerId(timerId)));
}